

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O2

bool __thiscall table::updatecheck(table *this,UpdateStatement *stmt)

{
  ExprType EVar1;
  undefined8 uVar2;
  pointer ppcVar3;
  column *pcVar4;
  __type _Var5;
  bool bVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  column *pcVar11;
  int *str1;
  Expr *pEVar12;
  long lVar13;
  ostream *poVar14;
  ExprType EVar15;
  int iVar16;
  column *pcVar17;
  char *pcVar18;
  pointer ppcVar19;
  string colName;
  fstream os;
  
  std::__cxx11::string::string
            ((string *)&os,
             (*(stmt->updates->
               super__Vector_base<hsql::UpdateClause_*,_std::allocator<hsql::UpdateClause_*>_>).
               _M_impl.super__Vector_impl_data._M_start)->column,(allocator *)&colName);
  pcVar11 = getColumn(this,(string *)&os);
  std::__cxx11::string::~string((string *)&os);
  if (pcVar11 == (column *)0x0) {
    pcVar18 = "no such column in table to update";
  }
  else {
    pcVar18 = "where condition is wrong";
    if (stmt->where != (Expr *)0x0) {
      std::__cxx11::string::string((string *)&colName,(string *)&this->filename);
      std::fstream::fstream(&os,(string *)&colName,_S_out|_S_in|_S_bin);
      std::__cxx11::string::~string((string *)&colName);
      bVar8 = false;
      for (iVar16 = 0; iVar10 = this->rowlength, iVar16 < iVar10; iVar16 = iVar16 + 1) {
        pEVar12 = stmt->where;
        if ((pEVar12->expr2->type == kExprLiteralInt) ||
           (EVar15 = pEVar12->expr->type, EVar15 == kExprLiteralInt)) {
          colName._M_dataplus._M_p = (pointer)&colName.field_2;
          colName._M_string_length = 0;
          colName.field_2._M_local_buf[0] = '\0';
          EVar15 = pEVar12->expr2->type;
          if (EVar15 == kExprLiteralInt) {
            if (pEVar12->expr->type == kExprLiteralString) goto LAB_00116a73;
            std::__cxx11::string::assign((char *)&colName);
            lVar13 = 0x10;
LAB_0011674e:
            uVar2 = *(undefined8 *)(*(long *)((long)&stmt->where->type + lVar13) + 0x48);
            ppcVar3 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            pcVar17 = (column *)0x0;
            for (ppcVar19 = (this->table_cols).
                            super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                            super__Vector_impl_data._M_start; ppcVar19 != ppcVar3;
                ppcVar19 = ppcVar19 + 1) {
              pcVar4 = *ppcVar19;
              _Var5 = std::operator==(&colName,&pcVar4->name);
              if (_Var5) {
                pcVar17 = pcVar4;
              }
            }
            if (pcVar17 == (column *)0x0) {
              poVar14 = std::operator<<((ostream *)&std::cout,"column ");
              poVar14 = std::operator<<(poVar14,(string *)&colName);
              poVar14 = std::operator<<(poVar14," do not exist in table");
              std::endl<char,std::char_traits<char>>(poVar14);
            }
            else {
              std::istream::seekg(&os,(long)pcVar17->col_offset + (long)this->rowSize * (long)iVar16
                                  ,0);
              iVar9 = pcVar17->element_truesize;
              if (iVar9 < 0) {
                iVar9 = -1;
              }
              str1 = (int *)operator_new__((long)iVar9);
              std::istream::read((char *)&os,(long)str1);
              cVar7 = stmt->where->opChar;
              iVar9 = (int)uVar2;
              if (cVar7 != '=') {
LAB_00116818:
                if (cVar7 == '>') {
                  bVar6 = std::operator==(&pcVar17->flag,"CHAR");
                  if (bVar6) {
                    pcVar18 = "cannot do > for char columns with int value";
                    goto LAB_00116aea;
                  }
                  if (*str1 <= iVar9) goto LAB_00116a03;
                  cVar7 = stmt->where->opChar;
                }
                if (cVar7 == '<') {
                  bVar6 = std::operator==(&pcVar17->flag,"CHAR");
                  if (bVar6) {
                    pcVar18 = "cannot do < for char columns with int value";
                    goto LAB_00116aea;
                  }
                  if (iVar9 <= *str1) goto LAB_00116a03;
                }
                std::__cxx11::string::~string((string *)&colName);
                pEVar12 = stmt->where;
                EVar15 = pEVar12->expr->type;
                goto LAB_0011688c;
              }
              bVar6 = std::operator==(&pcVar17->flag,"CHAR");
              if (!bVar6) {
                if (*str1 == iVar9) {
                  cVar7 = stmt->where->opChar;
                  goto LAB_00116818;
                }
                goto LAB_00116a03;
              }
              pcVar18 = "cannot do = for char columns with int value";
LAB_00116aea:
              poVar14 = std::operator<<((ostream *)&std::cout,pcVar18);
              std::endl<char,std::char_traits<char>>(poVar14);
              operator_delete(str1);
            }
          }
          else {
            if (EVar15 != kExprLiteralString) {
              std::__cxx11::string::assign((char *)&colName);
              lVar13 = 8;
              goto LAB_0011674e;
            }
LAB_00116a73:
            poVar14 = std::operator<<((ostream *)&std::cout,"cannot do compare between int and char"
                                     );
            std::endl<char,std::char_traits<char>>(poVar14);
          }
          std::__cxx11::string::~string((string *)&colName);
LAB_00116b14:
          std::fstream::~fstream(&os);
          return iVar10 <= iVar16;
        }
LAB_0011688c:
        EVar1 = pEVar12->expr2->type;
        if ((EVar15 != kExprColumnRef) || (EVar1 != kExprColumnRef)) {
          if ((EVar15 == kExprLiteralString) || (EVar1 == kExprLiteralString)) {
            colName._M_dataplus._M_p = (pointer)&colName.field_2;
            colName._M_string_length = 0;
            colName.field_2._M_local_buf[0] = '\0';
            if (pEVar12->expr2->type == kExprLiteralString) {
              std::__cxx11::string::assign((char *)&colName);
              lVar13 = 0x10;
            }
            else {
              std::__cxx11::string::assign((char *)&colName);
              lVar13 = 8;
            }
            pcVar18 = *(char **)(*(long *)((long)&stmt->where->type + lVar13) + 0x28);
            ppcVar3 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            pcVar17 = (column *)0x0;
            for (ppcVar19 = (this->table_cols).
                            super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                            super__Vector_impl_data._M_start; ppcVar19 != ppcVar3;
                ppcVar19 = ppcVar19 + 1) {
              pcVar4 = *ppcVar19;
              _Var5 = std::operator==(&colName,&pcVar4->name);
              if (_Var5) {
                pcVar17 = pcVar4;
              }
            }
            if (pcVar17 == (column *)0x0) {
              poVar14 = std::operator<<((ostream *)&std::cout,"column ");
              poVar14 = std::operator<<(poVar14,(string *)&colName);
              poVar14 = std::operator<<(poVar14," do not exist in table");
              std::endl<char,std::char_traits<char>>(poVar14);
              std::__cxx11::string::~string((string *)&colName);
              goto LAB_00116b14;
            }
            std::istream::seekg(&os,(long)pcVar17->col_offset + (long)this->rowSize * (long)iVar16,0
                               );
            iVar10 = pcVar17->element_truesize;
            if (iVar10 < 0) {
              iVar10 = -1;
            }
            str1 = (int *)operator_new__((long)iVar10);
            std::istream::read((char *)&os,(long)str1);
            cVar7 = stmt->where->opChar;
            if (cVar7 == '<') {
              iVar10 = util::compareChar((char *)str1,pcVar18);
              if (iVar10 != -1) goto LAB_00116a03;
            }
            else if (cVar7 == '>') {
              iVar10 = util::compareChar((char *)str1,pcVar18);
              if (iVar10 != 1) goto LAB_00116a03;
            }
            else if ((cVar7 == '=') && (bVar6 = util::compareString((char *)str1,pcVar18), !bVar6))
            {
LAB_00116a03:
              operator_delete(str1);
              std::__cxx11::string::~string((string *)&colName);
              goto LAB_00116a1f;
            }
            std::__cxx11::string::~string((string *)&colName);
          }
          std::operator==(&pcVar11->flag,"CHAR");
          bVar8 = true;
        }
LAB_00116a1f:
      }
      std::fstream::close();
      std::fstream::~fstream(&os);
      pcVar18 = "where condition is wrong";
      if (bVar8) {
        return iVar10 <= iVar16;
      }
    }
  }
  poVar14 = std::operator<<((ostream *)&std::cout,pcVar18);
  std::endl<char,std::char_traits<char>>(poVar14);
  return false;
}

Assistant:

bool table::updatecheck(hsql::UpdateStatement *stmt) {
    column* col = getColumn((*stmt->updates)[0]->column);
    bool updated = false;
    if(col == NULL){
        cout << "no such column in table to update" <<endl;
        return false;
    }
    if(stmt->where == nullptr){
        //set all column to same value
    }
    else {
        fstream os(getName(), ios::in|ios::out|ios::binary);

        for (int i = 0; i < getRowlength(); i++) {
            if (stmt->where->expr2->type == hsql::kExprLiteralInt || stmt->where->expr->type == hsql::kExprLiteralInt) {
                //select column
                string colName;
                int compareNum;
                if (stmt->where->expr2->type == hsql::kExprLiteralInt) {
                    if (stmt->where->expr->type == hsql::kExprLiteralString) {
                        cout << "cannot do compare between int and char" << endl;
                        return false;
                    }
                    colName = stmt->where->expr->name;
                    compareNum = (int) stmt->where->expr2->ival;
                } else {
                    if (stmt->where->expr2->type == hsql::kExprLiteralString) {
                        cout << "cannot do compare between int and char" << endl;
                        return false;
                    }
                    colName = stmt->where->expr2->name;
                    compareNum = (int) stmt->where->expr->ival;
                }
                column *tempcol = NULL;
                //check if table have this column
                for (auto col: table_cols) {
                    if (colName == col->name) {
                        tempcol = col;
                    }
                }
                if (tempcol == NULL) {
                    cout << "column " << colName << " do not exist in table" << endl;
                    return false;
                }
                //get column value
                os.seekg(i * getrowSize() + tempcol->col_offset);
                char *bytes = new char[tempcol->element_truesize];
                os.read(bytes, tempcol->element_truesize);
                //check =
                if (stmt->where->opChar == '=') {
                    if (tempcol->flag == "CHAR") {
                        cout << "cannot do = for char columns with int value" << endl;
                        delete bytes;
                        return false;
                    }
                    if (*(int *) bytes != compareNum) {
                        delete bytes;
                        continue;
                    }
                }
                //check >
                if (stmt->where->opChar == '>') {
                    if (tempcol->flag == "CHAR") {
                        cout << "cannot do > for char columns with int value" << endl;
                        delete bytes;
                        return false;
                    }
                    if (*(int *) bytes <= compareNum) {
                        delete bytes;
                        continue;
                    }
                }
                //check <
                if (stmt->where->opChar == '<') {
                    if (tempcol->flag == "CHAR") {
                        cout << "cannot do < for char columns with int value" << endl;
                        delete bytes;
                        return false;
                    }
                    if (*(int *) bytes >= compareNum) {
                        delete bytes;
                        continue;
                    }
                }

            }
            if (stmt->where->expr->type == hsql::kExprColumnRef && stmt->where->expr2->type == hsql::kExprColumnRef)
                continue;
            //do char
            if (stmt->where->expr2->type == hsql::kExprLiteralString ||
                stmt->where->expr->type == hsql::kExprLiteralString) {
                //select column
                string colName;
                char *compareChar;
                if (stmt->where->expr2->type == hsql::kExprLiteralString) {
                    colName = stmt->where->expr->name;
                    compareChar = stmt->where->expr2->name;
                } else {
                    colName = stmt->where->expr2->name;
                    compareChar = stmt->where->expr->name;
                }
                column *tempcol = NULL;
                //check if table have this column
                for (auto col: table_cols) {
                    if (colName == col->name) {
                        tempcol = col;
                    }
                }
                if (tempcol == NULL) {
                    cout << "column " << colName << " do not exist in table" << endl;
                    return false;
                }
                //get column value
                os.seekg(i * getrowSize() + tempcol->col_offset);
                char *bytes = new char[tempcol->element_truesize];
                os.read(bytes, tempcol->element_truesize);
                //check =
                if (stmt->where->opChar == '=') {
                    if (!util::compareString(bytes, compareChar)) {
                        delete bytes;
                        continue;
                    }
                }
                    //check >
                else if (stmt->where->opChar == '>') {
                    if (util::compareChar(bytes, compareChar) != 1) {
                        delete bytes;
                        continue;
                    }
                }
                    //check <
                else if (stmt->where->opChar == '<') {
                    if (util::compareChar(bytes, compareChar) != -1) {
                        delete bytes;
                        continue;
                    }
                }

            }
            //do update

            if (col != NULL) {

                if (col->flag == "CHAR") {
                    if (((*stmt->updates)[0]->value)->type == hsql::kExprLiteralString) {

                        updated = true;

                    } else {

                        updated = true;
                    }
                } else {

                    updated = true;

                }
            }

        }
        os.close();
    }
    if(updated)
        return true;
    else{
        cout<<"where condition is wrong"<<endl;
        return false;
    }

}